

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::varBumpActivity(Solver *this,Var v,double inc)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  int local_24;
  int i;
  double inc_local;
  Var v_local;
  Solver *this_local;
  
  pdVar4 = IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>,v);
  dVar1 = *pdVar4;
  *pdVar4 = inc + dVar1;
  if (1e+100 < inc + dVar1) {
    for (local_24 = 0; iVar3 = nVars(this), local_24 < iVar3; local_24 = local_24 + 1) {
      pdVar4 = IntMap<int,_double,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>
                          ,local_24);
      *pdVar4 = *pdVar4 * 1e-100;
    }
    this->var_inc = this->var_inc * 1e-100;
  }
  bVar2 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::inHeap
                    (&this->order_heap,v);
  if (bVar2) {
    Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::decrease
              (&this->order_heap,v);
  }
  return;
}

Assistant:

inline void Solver::varBumpActivity(Var v, double inc) {
    if ( (activity[v] += inc) > 1e100 ) {
        // Rescale:
        for (int i = 0; i < nVars(); i++)
            activity[i] *= 1e-100;
        var_inc *= 1e-100; }

    // Update order_heap with respect to new activity:
    if (order_heap.inHeap(v))
        order_heap.decrease(v); }